

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

void Abc_NtkPrintFanioNew(FILE *pFile,Abc_Ntk_t *pNtk,int fMffc)

{
  int *piVar1;
  Abc_Obj_t *pAVar2;
  bool bVar3;
  uint uVar4;
  void *__s;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  char Buffer [100];
  void *local_e0;
  uint local_d4;
  double local_a8;
  char local_98 [104];
  
  pVVar5 = pNtk->vObjs;
  if (pVVar5->nSize < 1) {
    dVar13 = 0.0;
    local_a8 = 0.0;
    uVar8 = 0;
    local_d4 = 0;
  }
  else {
    lVar12 = 0;
    iVar9 = 0;
    iVar10 = 0;
    local_d4 = 0;
    uVar8 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar5->pArray[lVar12];
      if (((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) &&
         ((fMffc == 0 || ((pAVar2->vFanouts).nSize != 1)))) {
        uVar4 = (pAVar2->vFanins).nSize;
        if (pNtk->ntkType == ABC_NTK_NETLIST) {
          uVar6 = *(uint *)((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray] + 0x2c);
        }
        else if (fMffc == 0) {
          uVar6 = (pAVar2->vFanouts).nSize;
        }
        else {
          uVar6 = Abc_NodeMffcSize(pAVar2);
        }
        iVar10 = iVar10 + uVar4;
        iVar9 = iVar9 + uVar6;
        if ((int)uVar8 <= (int)uVar4) {
          uVar8 = uVar4;
        }
        if ((int)local_d4 <= (int)uVar6) {
          local_d4 = uVar6;
        }
      }
      lVar12 = lVar12 + 1;
      pVVar5 = pNtk->vObjs;
    } while (lVar12 < pVVar5->nSize);
    local_a8 = (double)iVar10;
    dVar13 = (double)iVar9;
  }
  uVar4 = uVar8;
  if (1 < uVar8) {
    uVar7 = 0;
    uVar4 = 0;
    uVar6 = uVar8 - 1;
    if (uVar6 != 0) {
      do {
        uVar4 = uVar7 + 1;
        bVar3 = 9 < uVar6;
        uVar6 = uVar6 / 10;
        uVar7 = uVar4;
      } while (bVar3);
    }
  }
  uVar4 = uVar4 * 10 + 10;
  uVar6 = local_d4;
  if (1 < local_d4) {
    uVar6 = 0;
    uVar7 = local_d4 - 1;
    if (uVar7 != 0) {
      do {
        uVar6 = uVar6 + 1;
        bVar3 = 9 < uVar7;
        uVar7 = uVar7 / 10;
      } while (bVar3);
    }
  }
  uVar6 = uVar6 * 10 + 10;
  if ((int)uVar6 < (int)uVar4) {
    uVar6 = uVar4;
  }
  uVar4 = 0x10;
  if (0xe < uVar6 - 1) {
    uVar4 = uVar6;
  }
  if (uVar4 == 0) {
    local_e0 = (void *)0x0;
  }
  else {
    local_e0 = malloc((long)(int)uVar4 * 4);
  }
  if (local_e0 != (void *)0x0) {
    memset(local_e0,0,(long)(int)uVar6 * 4);
  }
  if (uVar4 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar4 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)(int)uVar6 << 2);
  }
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar12 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar5->pArray[lVar12];
      if (((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) &&
         ((fMffc == 0 || ((pAVar2->vFanouts).nSize != 1)))) {
        uVar4 = (pAVar2->vFanins).nSize;
        if (pNtk->ntkType == ABC_NTK_NETLIST) {
          uVar7 = *(uint *)((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray] + 0x2c);
        }
        else if (fMffc == 0) {
          uVar7 = (pAVar2->vFanouts).nSize;
        }
        else {
          uVar7 = Abc_NodeMffcSize(pAVar2);
        }
        if ((int)uVar4 < 10) {
          if ((int)uVar4 < 0) goto LAB_002f0d36;
LAB_002f0a26:
          if ((int)uVar6 <= (int)uVar4) goto LAB_002f0d36;
          piVar1 = (int *)((long)local_e0 + (ulong)uVar4 * 4);
          *piVar1 = *piVar1 + 1;
        }
        else {
          if ((int)uVar4 < 100) {
            uVar4 = uVar4 / 10 + 10;
            goto LAB_002f0a26;
          }
          if ((int)uVar4 < 1000) {
            uVar4 = uVar4 / 100 + 0x14;
            goto LAB_002f0a26;
          }
          if ((int)uVar4 < 10000) {
            uVar4 = uVar4 / 1000 + 0x1e;
            goto LAB_002f0a26;
          }
          if ((int)uVar4 < 100000) {
            uVar4 = uVar4 / 10000 + 0x28;
            goto LAB_002f0a26;
          }
          if ((int)uVar4 < 1000000) {
            uVar4 = uVar4 / 100000 + 0x32;
            goto LAB_002f0a26;
          }
          if ((int)uVar4 < 10000000) {
            uVar4 = uVar4 / 1000000 + 0x3c;
            goto LAB_002f0a26;
          }
        }
        if ((int)uVar7 < 10) {
          if ((int)uVar7 < 0) goto LAB_002f0d36;
        }
        else if ((int)uVar7 < 100) {
          uVar7 = uVar7 / 10 + 10;
        }
        else if ((int)uVar7 < 1000) {
          uVar7 = uVar7 / 100 + 0x14;
        }
        else if ((int)uVar7 < 10000) {
          uVar7 = uVar7 / 1000 + 0x1e;
        }
        else if ((int)uVar7 < 100000) {
          uVar7 = uVar7 / 10000 + 0x28;
        }
        else if ((int)uVar7 < 1000000) {
          uVar7 = uVar7 / 100000 + 0x32;
        }
        else {
          if (9999999 < (int)uVar7) goto LAB_002f0af6;
          uVar7 = uVar7 / 1000000 + 0x3c;
        }
        if ((int)uVar6 <= (int)uVar7) {
LAB_002f0d36:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar1 = (int *)((long)__s + (ulong)uVar7 * 4);
        *piVar1 = *piVar1 + 1;
      }
LAB_002f0af6:
      lVar12 = lVar12 + 1;
      pVVar5 = pNtk->vObjs;
    } while (lVar12 < pVVar5->nSize);
  }
  fwrite("The distribution of fanins and fanouts in the network:\n",0x37,1,(FILE *)pFile);
  fwrite("         Number   Nodes with fanin  Nodes with fanout\n",0x36,1,(FILE *)pFile);
  if (0 < (int)uVar6) {
    uVar11 = 0;
    do {
      if ((*(int *)((long)local_e0 + uVar11 * 4) != 0) || (*(int *)((long)__s + uVar11 * 4) != 0)) {
        if (uVar11 < 10) {
          fprintf((FILE *)pFile,"%15d : ",uVar11 & 0xffffffff);
        }
        else {
          iVar9 = (int)((uVar11 & 0xffffffff) / 10) * -10;
          dVar15 = (double)(int)((uVar11 & 0xffffffff) / 10);
          dVar14 = pow(10.0,dVar15);
          dVar15 = pow(10.0,dVar15);
          sprintf(local_98,"%d - %d",(ulong)(uint)(((int)uVar11 + iVar9) * (int)dVar14),
                  (ulong)(((int)uVar11 + iVar9 + 1) * (int)dVar15 - 1));
          fprintf((FILE *)pFile,"%15s : ",local_98);
        }
        if (*(int *)((long)local_e0 + uVar11 * 4) == 0) {
          fwrite("              ",0xe,1,(FILE *)pFile);
        }
        else {
          fprintf((FILE *)pFile,"%12d  ");
        }
        fwrite("    ",4,1,(FILE *)pFile);
        if (*(int *)((long)__s + uVar11 * 4) == 0) {
          fwrite("              ",0xe,1,(FILE *)pFile);
        }
        else {
          fprintf((FILE *)pFile,"%12d  ");
        }
        fputc(10,(FILE *)pFile);
      }
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  if (local_e0 != (void *)0x0) {
    free(local_e0);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  fprintf((FILE *)pFile,"Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",
          local_a8 / (double)pNtk->nObjCounts[7],dVar13 / (double)pNtk->nObjCounts[7],(ulong)uVar8,
          (ulong)local_d4);
  return;
}

Assistant:

void Abc_NtkPrintFanioNew( FILE * pFile, Abc_Ntk_t * pNtk, int fMffc )
{
    char Buffer[100];
    Abc_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts;
    int nFanins, nFanouts, nFaninsMax, nFanoutsMax, nFaninsAll, nFanoutsAll;
    int i, k, nSizeMax;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = 0;
    nFaninsAll = nFanoutsAll = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( fMffc && Abc_ObjFanoutNum(pNode) == 1 )
            continue;
        nFanins  = Abc_ObjFaninNum(pNode);
        if ( Abc_NtkIsNetlist(pNtk) )
            nFanouts = Abc_ObjFanoutNum( Abc_ObjFanout0(pNode) );
        else if ( fMffc )
            nFanouts = Abc_NodeMffcSize(pNode);
        else
            nFanouts = Abc_ObjFanoutNum(pNode);
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nFaninsMax   = Abc_MaxInt( nFaninsMax, nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( fMffc && Abc_ObjFanoutNum(pNode) == 1 )
            continue;
        nFanins  = Abc_ObjFaninNum(pNode);
        if ( Abc_NtkIsNetlist(pNtk) )
            nFanouts = Abc_ObjFanoutNum( Abc_ObjFanout0(pNode) );
        else if ( fMffc )
            nFanouts = Abc_NodeMffcSize(pNode);
        else
            nFanouts = Abc_ObjFanoutNum(pNode);

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
    }

    fprintf( pFile, "The distribution of fanins and fanouts in the network:\n" );
    fprintf( pFile, "         Number   Nodes with fanin  Nodes with fanout\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            fprintf( pFile, "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 );
            fprintf( pFile, "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12d  ", vFanins->pArray[k] );
        fprintf( pFile, "    " );
        if ( vFanouts->pArray[k] == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12d  ", vFanouts->pArray[k] );
        fprintf( pFile, "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );

    fprintf( pFile, "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",
        nFaninsMax,  1.0*nFaninsAll/Abc_NtkNodeNum(pNtk),
        nFanoutsMax, 1.0*nFanoutsAll/Abc_NtkNodeNum(pNtk)  );
/*
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        printf( "%d ", Abc_ObjFanoutNum(pNode) );
    }
    printf( "\n" );
*/
}